

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  pointer *this_00;
  pointer *this_01;
  RayTracingPipelineData *pRVar1;
  VulkanLogicalDevice *this_02;
  PipelineStateCacheVkImpl *this_03;
  size_type sVar2;
  size_type sVar3;
  Char *pCVar4;
  VkPipeline_T *pipeline;
  VkPipelineCache local_110;
  undefined1 local_e0 [8];
  string msg_1;
  undefined1 local_b8 [4];
  VkResult err;
  string msg;
  VkPipelineCache vkSPOCache;
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  vkShaderGroups;
  undefined1 local_68 [8];
  TShaderStages ShaderStages;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  VulkanLogicalDevice *LogicalDevice;
  RayTracingPipelineStateCreateInfo *CreateInfo_local;
  PipelineStateVkImpl *this_local;
  
  this_02 = RenderDeviceVkImpl::GetLogicalDevice
                      ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       .m_pDevice);
  this_00 = &ShaderModules.
             super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
          *)this_00);
  this_01 = &ShaderStages.
             super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::vector((vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
            *)this_01);
  InitInternalObjects<Diligent::RayTracingPipelineStateCreateInfo>
            ((TShaderStages *)local_68,this,CreateInfo,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)this_00,
             (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
              *)this_01);
  anon_unknown_227::BuildRTShaderGroupDescription
            ((vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
              *)&vkSPOCache,CreateInfo,
             (unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
              *)&(((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
                  m_pGraphicsPipelineData)->Desc).BlendDesc.RenderTargets[0].DestBlendAlpha,
             (TShaderStages *)local_68);
  if ((CreateInfo->super_PipelineStateCreateInfo).pPSOCache == (IPipelineStateCache *)0x0) {
    local_110 = (VkPipelineCache)0x0;
  }
  else {
    this_03 = ClassPtrCast<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>
                        ((CreateInfo->super_PipelineStateCreateInfo).pPSOCache);
    local_110 = PipelineStateCacheVkImpl::GetVkPipelineCache(this_03);
  }
  msg.field_2._8_8_ = local_110;
  anon_unknown_227::CreateRayTracingPipeline
            ((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_pDevice,
             (vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              *)&ShaderModules.
                 super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
              *)&vkSPOCache,&this->m_PipelineLayout,
             &(this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_Desc,(RayTracingPipelineDesc *)
                      (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
                      m_pGraphicsPipelineData,&this->m_Pipeline,local_110);
  sVar2 = std::
          unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
          ::size((unordered_map<Diligent::HashMapStringKey,_unsigned_int,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>_>
                  *)&(((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
                      m_pGraphicsPipelineData)->Desc).BlendDesc.RenderTargets[0].DestBlendAlpha);
  sVar3 = std::
          vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ::size((vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  *)&vkSPOCache);
  if (sVar2 != sVar3) {
    FormatString<char[108]>
              ((string *)local_b8,
               (char (*) [108])
               "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug."
              );
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37c);
    std::__cxx11::string::~string((string *)local_b8);
  }
  pipeline = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkPipeline_T_
                       ((VulkanObjectWrapper *)&this->m_Pipeline);
  sVar3 = std::
          vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
          ::size((vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  *)&vkSPOCache);
  pRVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
           m_pRayTracingPipelineData;
  msg_1.field_2._12_4_ =
       VulkanUtilities::VulkanLogicalDevice::GetRayTracingShaderGroupHandles
                 (this_02,pipeline,0,(uint32_t)sVar3,(ulong)pRVar1->ShaderDataSize,
                  pRVar1->ShaderHandles);
  if (msg_1.field_2._12_4_ != VK_SUCCESS) {
    FormatString<char[35]>((string *)local_e0,(char (*) [35])"Failed to get shader group handles");
    pCVar4 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar4,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37f);
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ::~vector((vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
             *)&vkSPOCache);
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector((vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
             *)local_68);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector((vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
             *)&ShaderStages.
                super__Vector_base<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~vector((vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
           *)&ShaderModules.
              super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const RayTracingPipelineStateCreateInfo& CreateInfo)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    const PipelineStateVkImpl::TShaderStages                ShaderStages   = InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);
    const std::vector<VkRayTracingShaderGroupCreateInfoKHR> vkShaderGroups = BuildRTShaderGroupDescription(CreateInfo, m_pRayTracingPipelineData->NameToGroupIndex, ShaderStages);
    const VkPipelineCache                                   vkSPOCache     = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;

    CreateRayTracingPipeline(m_pDevice, vkShaderStages, vkShaderGroups, m_PipelineLayout, m_Desc, m_pRayTracingPipelineData->Desc, m_Pipeline, vkSPOCache);

    VERIFY(m_pRayTracingPipelineData->NameToGroupIndex.size() == vkShaderGroups.size(),
           "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug.");
    // Get shader group handles from the PSO.
    VkResult err = LogicalDevice.GetRayTracingShaderGroupHandles(m_Pipeline, 0, static_cast<uint32_t>(vkShaderGroups.size()), m_pRayTracingPipelineData->ShaderDataSize, m_pRayTracingPipelineData->ShaderHandles);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get shader group handles");
    (void)err;
}